

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O1

void rsg::(anonymous_namespace)::convertValueRangeTempl<float,float>
               (ConstValueRangeAccess src,ValueRangeAccess dst)

{
  Scalar SVar1;
  Scalar SVar2;
  
  SVar2 = (Scalar)(src.m_min)->intVal;
  SVar1 = (Scalar)(src.m_max)->intVal;
  if ((SVar2.intVal != -0x800000) && (SVar2.intVal == 0x7f800000)) {
    SVar2.intVal = 0x7f800000;
  }
  if ((SVar1.intVal != -0x800000) && (SVar1.intVal == 0x7f800000)) {
    SVar1.intVal = 0x7f800000;
  }
  *dst.super_ConstValueRangeAccess.m_min = SVar2;
  *dst.super_ConstValueRangeAccess.m_max = SVar1;
  return;
}

Assistant:

ConstValueAccess			getMax					(void) const	{ return ConstValueAccess(*m_type, m_max);	}